

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

uchar __thiscall Map::GenerateNPCIndex(Map *this)

{
  pointer ppNVar1;
  NPC *pNVar2;
  uchar uVar3;
  const_iterator __end1;
  const_iterator __begin1;
  pointer ppNVar4;
  
  ppNVar1 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = '\x01';
  ppNVar4 = ppNVar1;
  while (ppNVar4 !=
         (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    pNVar2 = *ppNVar4;
    ppNVar4 = ppNVar4 + 1;
    if (pNVar2->index == uVar3) {
      uVar3 = uVar3 + '\x01';
      ppNVar4 = ppNVar1;
    }
  }
  return uVar3;
}

Assistant:

unsigned char Map::GenerateNPCIndex() const
{
	unsigned char lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->npcs, npc)
	{
		if (npc->index == lowest_free_id)
		{
			lowest_free_id = npc->index + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}